

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O1

void __thiscall FIX::HttpServer::start(HttpServer *this)

{
  RuntimeError *this_00;
  bool bVar1;
  SessionSettings *s;
  string local_40;
  
  this->m_stop = false;
  s = &this->m_settings;
  onConfigure(this,s);
  onInitialize(this,s);
  bVar1 = thread_spawn(startThread,this,&this->m_threadid);
  if (bVar1) {
    return;
  }
  this_00 = (RuntimeError *)__cxa_allocate_exception(0x50);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Unable to spawn thread","");
  RuntimeError::RuntimeError(this_00,&local_40);
  __cxa_throw(this_00,&RuntimeError::typeinfo,FIX::Exception::~Exception);
}

Assistant:

EXCEPT(ConfigError, RuntimeError) {
  m_stop = false;
  onConfigure(m_settings);
  onInitialize(m_settings);

  if (!thread_spawn(&startThread, this, m_threadid)) {
    throw RuntimeError("Unable to spawn thread");
  }
}